

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O0

char * Nm_ManCreateUniqueName(Nm_Man_t *p,int ObjId)

{
  Nm_Entry_t *pNVar1;
  uint local_2c;
  int i;
  Nm_Entry_t *pEntry;
  int ObjId_local;
  Nm_Man_t *p_local;
  
  pNVar1 = Nm_ManTableLookupId(p,ObjId);
  if (pNVar1 == (Nm_Entry_t *)0x0) {
    sprintf(Nm_ManCreateUniqueName::NameStr,"n%d",(ulong)(uint)ObjId);
    local_2c = 1;
    while( true ) {
      pNVar1 = Nm_ManTableLookupName(p,Nm_ManCreateUniqueName::NameStr,-1);
      if (pNVar1 == (Nm_Entry_t *)0x0) break;
      sprintf(Nm_ManCreateUniqueName::NameStr,"n%d_%d",(ulong)(uint)ObjId,(ulong)local_2c);
      local_2c = local_2c + 1;
    }
    p_local = (Nm_Man_t *)Nm_ManCreateUniqueName::NameStr;
  }
  else {
    p_local = (Nm_Man_t *)(pNVar1 + 1);
  }
  return (char *)p_local;
}

Assistant:

char * Nm_ManCreateUniqueName( Nm_Man_t * p, int ObjId )
{
    static char NameStr[1000];
    Nm_Entry_t * pEntry;
    int i;
    if ( (pEntry = Nm_ManTableLookupId(p, ObjId)) )
        return pEntry->Name;
    sprintf( NameStr, "n%d", ObjId );
    for ( i = 1; Nm_ManTableLookupName(p, NameStr, -1); i++ )
        sprintf( NameStr, "n%d_%d", ObjId, i );
    return NameStr;
}